

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::RoundCase::compare(RoundCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  uint uVar3;
  deUint32 dVar4;
  uint uVar5;
  ostream *poVar6;
  Hex<8UL> hex;
  ulong uVar7;
  ulong uVar8;
  deUint32 aBits;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  deUint32 u32;
  HexFloat local_3c;
  HexFloat local_38;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    uVar8 = 0;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      fVar11 = *(float *)((long)*inputs + uVar8 * 4);
      fVar13 = *(float *)((long)*outputs + uVar8 * 4);
      fVar10 = floorf(fVar11);
      if ((fVar11 - fVar10 != 0.5) || (NAN(fVar11 - fVar10))) {
        fVar11 = roundEven(fVar11);
        if (PVar1 == PRECISION_HIGHP) {
          uVar5 = (int)fVar11 - (int)fVar13;
          if ((uint)fVar11 < (uint)fVar13) {
            uVar5 = -((int)fVar11 - (int)fVar13);
          }
        }
        else {
          uVar5 = getUlpDiffIgnoreZeroSign(fVar13,fVar11);
        }
        if (uVar5 != 0) {
          poVar6 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,
                                   "Expected [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
          poVar6 = std::operator<<(poVar6,"] = ");
          local_3c.value = fVar11;
          poVar6 = Functional::operator<<(poVar6,&local_3c);
          poVar6 = std::operator<<(poVar6,", got ULP diff ");
LAB_00473e4c:
          hex.value._4_4_ = 0;
          hex.value._0_4_ = uVar5;
          tcu::Format::operator<<(poVar6,hex);
          return false;
        }
      }
      else {
        fVar11 = ceilf(fVar11);
        if (PVar1 == PRECISION_HIGHP) {
          uVar5 = (int)fVar11 - (int)fVar13;
          if ((uint)fVar11 < (uint)fVar13) {
            uVar5 = -((int)fVar11 - (int)fVar13);
          }
          dVar4 = (int)fVar10 - (int)fVar13;
          if ((uint)fVar10 < (uint)fVar13) {
            dVar4 = -((int)fVar10 - (int)fVar13);
          }
        }
        else {
          dVar4 = getUlpDiffIgnoreZeroSign(fVar13,fVar10);
          uVar5 = getUlpDiffIgnoreZeroSign(fVar13,fVar11);
        }
        if ((dVar4 != 0) && (uVar5 != 0)) {
          poVar6 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,
                                   "Expected [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
          poVar6 = std::operator<<(poVar6,"] = ");
          local_34.value = fVar10;
          poVar6 = Functional::operator<<(poVar6,&local_34);
          poVar6 = std::operator<<(poVar6," or ");
          local_38.value = fVar11;
          poVar6 = Functional::operator<<(poVar6,&local_38);
          poVar6 = std::operator<<(poVar6,", got ULP diff ");
          if (dVar4 < uVar5) {
            uVar5 = dVar4;
          }
          goto LAB_00473e4c;
        }
      }
    }
  }
  else {
    uVar5 = ~(-1 << (0x17U - (char)*(int *)(&DAT_00817b9c + (ulong)PVar1 * 4) & 0x1f));
    fVar11 = getEpsFromBits(1.0,*(int *)(&DAT_00817b9c + (ulong)PVar1 * 4));
    uVar8 = 0;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar8;
    }
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      fVar13 = *(float *)((long)*inputs + uVar8 * 4);
      fVar10 = *(float *)((long)*outputs + uVar8 * 4);
      fVar12 = roundEven(fVar13 - fVar11);
      fVar13 = roundEven(fVar13 + fVar11);
      iVar9 = (int)fVar12;
      do {
        if ((int)fVar13 < iVar9) {
          poVar6 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,
                                   "Expected [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
          poVar6 = std::operator<<(poVar6,"] = [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)fVar12);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)fVar13);
          poVar6 = std::operator<<(poVar6,"] with ULP threshold ");
          goto LAB_00473e4c;
        }
        dVar4 = getUlpDiffIgnoreZeroSign(fVar10,(float)iVar9);
        iVar9 = iVar9 + 1;
      } while (uVar5 < dVar4);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];

				if (deFloatFrac(in0) == 0.5f)
				{
					// Allow both ceil(in) and floor(in)
					const float		ref0		= deFloatFloor(in0);
					const float		ref1		= deFloatCeil(in0);
					const deUint32	ulpDiff0	= hasZeroSign ? getUlpDiff(out0, ref0) : getUlpDiffIgnoreZeroSign(out0, ref0);
					const deUint32	ulpDiff1	= hasZeroSign ? getUlpDiff(out0, ref1) : getUlpDiffIgnoreZeroSign(out0, ref1);

					if (ulpDiff0 > 0 && ulpDiff1 > 0)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " or " << HexFloat(ref1) << ", got ULP diff " << tcu::toHex(de::min(ulpDiff0, ulpDiff1));
						return false;
					}
				}
				else
				{
					// Require exact result
					const float		ref		= roundEven(in0);
					const deUint32	ulpDiff	= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

					if (ulpDiff > 0)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
						return false;
					}
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}